

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeCellSizeCheck(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  long in_RDI;
  int cellOffset;
  int usableSize;
  u8 *data;
  int pc;
  int sz;
  int i;
  int iCellLast;
  int iCellFirst;
  int local_1c;
  int local_18;
  
  uVar1 = *(ushort *)(in_RDI + 0x12);
  uVar2 = *(ushort *)(in_RDI + 0x18);
  iVar7 = *(int *)(*(long *)(in_RDI + 0x48) + 0x38);
  local_18 = iVar7 + -4;
  lVar4 = *(long *)(in_RDI + 0x50);
  uVar3 = *(ushort *)(in_RDI + 0x12);
  if (*(char *)(in_RDI + 8) == '\0') {
    local_18 = iVar7 + -5;
  }
  local_1c = 0;
  while( true ) {
    if ((int)(uint)*(ushort *)(in_RDI + 0x18) <= local_1c) {
      return 0;
    }
    uVar6 = (uint)CONCAT11(*(undefined1 *)(lVar4 + (int)((uint)uVar3 + local_1c * 2)),
                           *(undefined1 *)(lVar4 + 1 + (long)(int)((uint)uVar3 + local_1c * 2)));
    if ((uVar6 < (uint)uVar1 + (uint)uVar2 * 2) || (local_18 < (int)uVar6)) break;
    uVar5 = (**(code **)(in_RDI + 0x78))(in_RDI,lVar4 + (int)uVar6);
    if (iVar7 < (int)(uVar6 + uVar5)) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
    local_1c = local_1c + 1;
  }
  iVar7 = sqlite3CorruptError(0);
  return iVar7;
}

Assistant:

static SQLITE_NOINLINE int btreeCellSizeCheck(MemPage *pPage){
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */
  int i;             /* Index into the cell pointer array */
  int sz;            /* Size of a cell */
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Maximum usable space on the page */
  int cellOffset;    /* Start of cell content area */

  iCellFirst = pPage->cellOffset + 2*pPage->nCell;
  usableSize = pPage->pBt->usableSize;
  iCellLast = usableSize - 4;
  data = pPage->aData;
  cellOffset = pPage->cellOffset;
  if( !pPage->leaf ) iCellLast--;
  for(i=0; i<pPage->nCell; i++){
    pc = get2byteAligned(&data[cellOffset+i*2]);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    sz = pPage->xCellSize(pPage, &data[pc]);
    testcase( pc+sz==usableSize );
    if( pc+sz>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}